

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

size_t aead_do_decrypt(ptls_aead_context_t *_ctx,void *output,void *input,size_t inlen,uint64_t seq,
                      void *aad,size_t aadlen)

{
  int iVar1;
  ptls_fusion_aesgcm_context_t *ctx_00;
  size_t unaff_RBX;
  ulong inlen_00;
  size_t capacity;
  aesgcm_context *ctx;
  void *unaff_R12;
  undefined1 auVar2 [16];
  __m128i ctr;
  
  if (inlen < 0x10) {
    return 0xffffffffffffffff;
  }
  capacity = (inlen + aadlen) - 0x10;
  inlen_00 = inlen - 0x10;
  ctx_00 = (ptls_fusion_aesgcm_context_t *)_ctx[1].algo;
  if (ctx_00->capacity < capacity) {
    ctx_00 = ptls_fusion_aesgcm_set_capacity(ctx_00,capacity);
    _ctx[1].algo = (st_ptls_aead_algorithm_t *)ctx_00;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = seq;
  vpslldq_avx(auVar2,4);
  ctr[1] = aadlen;
  ctr[0] = (longlong)aad;
  iVar1 = ptls_fusion_aesgcm_decrypt
                    (ctx_00,output,input,inlen_00,ctr,(void *)((long)input + inlen_00),unaff_RBX,
                     unaff_R12);
  return -(ulong)(iVar1 == 0) | inlen_00;
}

Assistant:

static size_t aead_do_decrypt(ptls_aead_context_t *_ctx, void *_output, const void *input, size_t inlen, uint64_t seq,
                              const void *aad, size_t aadlen)
{
    struct aead_crypto_context_t *ctx = (struct aead_crypto_context_t *)_ctx;
    uint8_t *output = _output, iv[PTLS_MAX_IV_SIZE];
    size_t off = 0, tag_size = ctx->super.algo->tag_size;
    int blocklen, ret;

    if (inlen < tag_size)
        return SIZE_MAX;

    ptls_aead__build_iv(ctx->super.algo, iv, ctx->static_iv, seq);
    ret = EVP_DecryptInit_ex(ctx->evp_ctx, NULL, NULL, NULL, iv);
    assert(ret);
    if (aadlen != 0) {
        ret = EVP_DecryptUpdate(ctx->evp_ctx, NULL, &blocklen, aad, (int)aadlen);
        assert(ret);
    }
    ret = EVP_DecryptUpdate(ctx->evp_ctx, output + off, &blocklen, input, (int)(inlen - tag_size));
    assert(ret);
    off += blocklen;
    if (!EVP_CIPHER_CTX_ctrl(ctx->evp_ctx, EVP_CTRL_GCM_SET_TAG, (int)tag_size, (void *)((uint8_t *)input + inlen - tag_size)))
        return SIZE_MAX;
    if (!EVP_DecryptFinal_ex(ctx->evp_ctx, output + off, &blocklen))
        return SIZE_MAX;
    off += blocklen;

    return off;
}